

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O1

Solution * ConstructionHeuristics::RequestsFirst(Solution *solution)

{
  Turn *this;
  pointer pcVar1;
  size_t sVar2;
  pointer pSVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  result_type rVar8;
  int iVar9;
  int iVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar11;
  Scenario *pSVar12;
  WeekData *pWVar13;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> *__x;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar14;
  pointer ppTVar15;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  string *psVar16;
  const_iterator cVar17;
  ShiftType *pSVar18;
  const_iterator cVar19;
  _Base_ptr p_Var20;
  Nurse *this_01;
  string *psVar21;
  __normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
  __first;
  int iVar22;
  long lVar23;
  pointer __x_00;
  ulong uVar24;
  int iVar25;
  pointer pSVar26;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> shiftOffRequests;
  ShiftOffRequest shiftOffRequest;
  vector<Turn_*,_std::allocator<Turn_*>_> day;
  type random;
  vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_> local_110;
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  string local_98;
  vector<Turn_*,_std::allocator<Turn_*>_> local_78;
  pointer local_60;
  vector<Turn_*,_std::allocator<Turn_*>_> *local_58;
  pointer local_50;
  pointer local_48;
  param_type local_40;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  uVar6 = std::chrono::_V2::system_clock::now();
  pmVar11 = Solution::getNurses_abi_cxx11_(solution);
  local_40 = (param_type)
             (((pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count << 0x20) + -0x100000000);
  local_38._M_x = (ulong)uVar6 % 0x7fffffff + (ulong)((ulong)uVar6 % 0x7fffffff == 0);
  pSVar12 = Scenario::getInstance();
  pWVar13 = Scenario::getWeekData(pSVar12);
  __x = WeekData::getShiftOffRequests(pWVar13);
  std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::vector(&local_110,__x);
  pvVar14 = Solution::getTurns(solution);
  __x_00 = (pvVar14->
           super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (pvVar14->
             super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (__x_00 != local_60) {
    do {
      local_58 = __x_00;
      std::vector<Turn_*,_std::allocator<Turn_*>_>::vector(&local_78,__x_00);
      local_50 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppTVar15 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar4 = true;
      }
      else {
        do {
          this = *ppTVar15;
          local_48 = ppTVar15;
          pSVar12 = Scenario::getInstance();
          pWVar13 = Scenario::getWeekData(pSVar12);
          this_00 = &WeekData::getRequirements_abi_cxx11_(pWVar13)->_M_h;
          psVar16 = Turn::getSkill_abi_cxx11_(this);
          cVar17 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(this_00,psVar16);
          if (cVar17.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
LAB_00119ad7:
            std::__throw_out_of_range("_Map_base::at");
LAB_00119ae3:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          pSVar18 = Turn::getShiftType(this);
          psVar16 = ShiftType::getId_abi_cxx11_(pSVar18);
          cVar19 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)((long)cVar17.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>_>_>_>,_true>
                                    ._M_cur + 0x28),psVar16);
          if (cVar19.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00119ad7;
          uVar6 = Turn::getDay(this);
          if ((ulong)(*(long *)((long)cVar19.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                      ._M_cur + 0x30) -
                      *(long *)((long)cVar19.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                      ._M_cur + 0x28) >> 3) <= (ulong)uVar6) goto LAB_00119ae3;
          iVar7 = DayRequirement::getMinimumCoverage
                            (*(DayRequirement **)
                              (*(long *)((long)cVar19.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<DayRequirement_*,_std::allocator<DayRequirement_*>_>_>,_true>
                                               ._M_cur + 0x28) + (ulong)uVar6 * 8));
          if (0 < iVar7) {
            uVar24 = 0;
            iVar25 = 0;
            do {
              pmVar11 = Solution::getNurses_abi_cxx11_(solution);
              p_Var20 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              rVar8 = std::uniform_int_distribution<int>::operator()
                                ((uniform_int_distribution<int> *)&local_40,&local_38,&local_40);
              lVar23 = (long)rVar8;
              if (rVar8 < 1) {
                if (rVar8 != 0) {
                  do {
                    p_Var20 = (_Base_ptr)std::_Rb_tree_decrement(p_Var20);
                    lVar23 = lVar23 + 1;
                  } while (lVar23 != 0);
                }
              }
              else {
                do {
                  p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
                  lVar23 = lVar23 + -1;
                } while (lVar23 != 0);
              }
              pSVar3 = local_110.
                       super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              if (local_110.super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  local_110.super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
LAB_001199e4:
                bVar4 = Solution::assignNurseToTurn(solution,*(NurseSolution **)(p_Var20 + 2),this);
                pmVar11 = Solution::getNurses_abi_cxx11_(solution);
                cVar5 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_node_count * 2 <= uVar24;
                iVar25 = (iVar25 - (uint)!bVar4) + 1;
              }
              else {
                bVar4 = false;
                pSVar26 = local_110.
                          super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  local_f8[0] = local_e8;
                  pcVar1 = (pSVar26->nurse)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_f8,pcVar1,pcVar1 + (pSVar26->nurse)._M_string_length);
                  local_d8[0] = local_c8;
                  pcVar1 = (pSVar26->shiftType)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_d8,pcVar1,
                             pcVar1 + (pSVar26->shiftType)._M_string_length);
                  local_b8[0] = local_a8;
                  pcVar1 = (pSVar26->day)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_b8,pcVar1,pcVar1 + (pSVar26->day)._M_string_length);
                  psVar16 = ShiftOffRequest::getNurse_abi_cxx11_((ShiftOffRequest *)local_f8);
                  this_01 = NurseSolution::getNurse(*(NurseSolution **)(p_Var20 + 2));
                  psVar21 = Nurse::getId_abi_cxx11_(this_01);
                  sVar2 = psVar16->_M_string_length;
                  if ((sVar2 != psVar21->_M_string_length) ||
                     ((iVar22 = 0xb, sVar2 != 0 &&
                      (iVar9 = bcmp((psVar16->_M_dataplus)._M_p,(psVar21->_M_dataplus)._M_p,sVar2),
                      iVar9 != 0)))) {
                    pSVar12 = Scenario::getInstance();
                    psVar16 = ShiftOffRequest::getDay_abi_cxx11_((ShiftOffRequest *)local_f8);
                    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                    pcVar1 = (psVar16->_M_dataplus)._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_98,pcVar1,pcVar1 + psVar16->_M_string_length);
                    iVar9 = Scenario::getDayOfWeek(pSVar12,&local_98);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_98._M_dataplus._M_p != &local_98.field_2) {
                      operator_delete(local_98._M_dataplus._M_p,
                                      local_98.field_2._M_allocated_capacity + 1);
                    }
                    iVar10 = Turn::getDay(this);
                    iVar22 = 0;
                    if (iVar10 == iVar9) {
                      psVar16 = ShiftOffRequest::getShiftType_abi_cxx11_
                                          ((ShiftOffRequest *)local_f8);
                      iVar9 = std::__cxx11::string::compare((char *)psVar16);
                      if (iVar9 != 0) {
                        psVar16 = ShiftOffRequest::getShiftType_abi_cxx11_
                                            ((ShiftOffRequest *)local_f8);
                        pSVar18 = Turn::getShiftType(this);
                        psVar21 = ShiftType::getId_abi_cxx11_(pSVar18);
                        sVar2 = psVar16->_M_string_length;
                        if ((sVar2 != psVar21->_M_string_length) ||
                           ((sVar2 != 0 &&
                            (iVar9 = bcmp((psVar16->_M_dataplus)._M_p,(psVar21->_M_dataplus)._M_p,
                                          sVar2), iVar9 != 0)))) goto LAB_00119954;
                      }
                      __first = std::
                                __remove_if<__gnu_cxx::__normal_iterator<ShiftOffRequest*,std::vector<ShiftOffRequest,std::allocator<ShiftOffRequest>>>,__gnu_cxx::__ops::_Iter_equals_val<ShiftOffRequest_const>>
                                          ((__normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                                            )local_110.
                                             super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                           (__normal_iterator<ShiftOffRequest_*,_std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>_>
                                            )local_110.
                                             super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,
                                           (ShiftOffRequest *)local_f8);
                      std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::_M_erase
                                (&local_110,(iterator)__first._M_current,
                                 (iterator)
                                 local_110.
                                 super__Vector_base<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
                      iVar22 = 10;
                      bVar4 = true;
                    }
                  }
LAB_00119954:
                  if (local_b8[0] != local_a8) {
                    operator_delete(local_b8[0],local_a8[0] + 1);
                  }
                  if (local_d8[0] != local_c8) {
                    operator_delete(local_d8[0],local_c8[0] + 1);
                  }
                  if (local_f8[0] != local_e8) {
                    operator_delete(local_f8[0],local_e8[0] + 1);
                  }
                } while (((iVar22 == 0xb) || (iVar22 == 0)) &&
                        (pSVar26 = pSVar26 + 1, pSVar26 != pSVar3));
                cVar5 = '\t';
                if (!bVar4) goto LAB_001199e4;
              }
              if ((cVar5 != '\t') && (cVar5 != '\0')) goto LAB_00119a48;
              uVar24 = uVar24 + 1;
            } while (iVar25 < iVar7);
          }
          cVar5 = '\a';
LAB_00119a48:
          bVar4 = cVar5 == '\0' || cVar5 == '\a';
        } while ((cVar5 == '\0' || cVar5 == '\a') && (ppTVar15 = local_48 + 1, ppTVar15 != local_50)
                );
      }
      if (local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (!bVar4) {
        solution = (Solution *)0x0;
        break;
      }
      __x_00 = local_58 + 1;
    } while (__x_00 != local_60);
  }
  std::vector<ShiftOffRequest,_std::allocator<ShiftOffRequest>_>::~vector(&local_110);
  return solution;
}

Assistant:

Solution* ConstructionHeuristics::RequestsFirst(Solution* solution){
    default_random_engine generator((unsigned int) chrono::system_clock::now().time_since_epoch().count());
    uniform_int_distribution<int> distribution(0, (int) solution->getNurses().size()-1);

    auto random = bind(distribution, generator);

    vector<ShiftOffRequest> shiftOffRequests = Scenario::getInstance()->getWeekData().getShiftOffRequests();


    for (vector<Turn *> day : solution->getTurns())
        for (Turn *turn : day) {
            int requiredNurses = Scenario::getInstance()->getWeekData().getRequirements().at(turn->getSkill()).at(turn->getShiftType()->getId()).at((unsigned int)turn->getDay())->getMinimumCoverage();
            int loop = 0;
            outerLoop: for(int i = 0; i < requiredNurses;i++)
            {
                loop++;
                auto iter = solution->getNurses().begin();
                std::advance( iter, random() );
                //check if nurse requested day off
                bool cont = false;

                for(ShiftOffRequest shiftOffRequest: shiftOffRequests) {
                    if(shiftOffRequest.getNurse() == iter->second->getNurse()->getId())
                        continue;
                    int dayInt = Scenario::getInstance()->getDayOfWeek(shiftOffRequest.getDay());
                    if(turn->getDay() == dayInt && (shiftOffRequest.getShiftType() == "Any" || shiftOffRequest.getShiftType() == turn->getShiftType()->getId())) {
                        cont = true;
                        shiftOffRequests.erase(std::remove(shiftOffRequests.begin(), shiftOffRequests.end(), shiftOffRequest), shiftOffRequests.end());
                        break;
                    }
                }
                if(cont){
                    i--;
                    continue;
                }
                if(!solution->assignNurseToTurn(iter->second, turn))
                    i--;
                if(loop > solution->getNurses().size()*2)
                    return nullptr;
            }
        }
    return solution;
}